

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O3

void __thiscall Matrix4f::setSubmatrix2x2(Matrix4f *this,int i0,int j0,Matrix2f *m)

{
  bool bVar1;
  float *pfVar2;
  bool bVar3;
  long lVar4;
  
  lVar4 = 0;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    pfVar2 = Matrix2f::operator()(m,(int)lVar4,0);
    this->m_elements[(long)j0 * 4 + lVar4 + i0] = *pfVar2;
    pfVar2 = Matrix2f::operator()(m,(int)lVar4,1);
    this->m_elements[(long)j0 * 4 + (long)i0 + lVar4 + 4] = *pfVar2;
    lVar4 = 1;
    bVar1 = false;
  } while (bVar3);
  return;
}

Assistant:

void Matrix4f::setSubmatrix2x2( int i0, int j0, const Matrix2f& m )
{
	for( int i = 0; i < 2; ++i )
	{
		for( int j = 0; j < 2; ++j )
		{
			( *this )( i + i0, j + j0 ) = m( i, j );
		}
	}
}